

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_modifiers.cpp
# Opt level: O2

bool __thiscall
icu_63::number::impl::SimpleModifier::semanticallyEquivalent(SimpleModifier *this,Modifier *other)

{
  ModifierStore *pMVar1;
  UBool UVar2;
  long lVar3;
  bool bVar4;
  
  bVar4 = false;
  lVar3 = __dynamic_cast(other,&Modifier::typeinfo,&typeinfo,0);
  if (lVar3 != 0) {
    pMVar1 = (this->fParameters).obj;
    if (pMVar1 == (ModifierStore *)0x0) {
      UVar2 = UnicodeString::operator==(&this->fCompiledPattern,(UnicodeString *)(lVar3 + 8));
      if ((UVar2 == '\0') || (this->fField != *(Field *)(lVar3 + 0x48))) {
        bVar4 = false;
      }
      else {
        bVar4 = this->fStrong == (bool)*(char *)(lVar3 + 0x4c);
      }
    }
    else {
      bVar4 = pMVar1 == *(ModifierStore **)(lVar3 + 0x60);
    }
  }
  return bVar4;
}

Assistant:

bool SimpleModifier::semanticallyEquivalent(const Modifier& other) const {
    auto* _other = dynamic_cast<const SimpleModifier*>(&other);
    if (_other == nullptr) {
        return false;
    }
    if (fParameters.obj != nullptr) {
        return fParameters.obj == _other->fParameters.obj;
    }
    return fCompiledPattern == _other->fCompiledPattern
        && fField == _other->fField
        && fStrong == _other->fStrong;
}